

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::ArrayLocatorMethod::checkArguments
          (ArrayLocatorMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *iterExpr)

{
  Compilation *this_00;
  bool bVar1;
  Type *pTVar2;
  Type *pTVar3;
  QueueType *pQVar4;
  Diagnostic *pDVar5;
  uint *args_1;
  uint local_3c [3];
  
  this_00 = ((context->scope).ptr)->compilation;
  bVar1 = SystemSubroutine::checkArgCount(&this->super_SystemSubroutine,context,true,args,range,0,0)
  ;
  if (bVar1) {
    if (iterExpr == (Expression *)0x0) {
      pDVar5 = ASTContext::addDiag(context,(DiagCode)0xb,range);
      Diagnostic::operator<<(pDVar5,&(this->super_SystemSubroutine).name);
    }
    else {
      bVar1 = ASTContext::requireBooleanConvertible(context,iterExpr);
      if (bVar1) {
        pTVar3 = ((*args->_M_ptr)->type).ptr;
        if (this->isIndexed == true) {
          pTVar2 = pTVar3->canonical;
          if (pTVar2 == (Type *)0x0) {
            Type::resolveCanonical(pTVar3);
            pTVar2 = pTVar3->canonical;
          }
          if ((pTVar2->super_Symbol).kind == AssociativeArrayType) {
            pTVar3 = Type::getAssociativeIndexType(pTVar3);
            if (pTVar3 == (Type *)0x0) {
              pDVar5 = ASTContext::addDiag(context,(DiagCode)0x3000b,range);
              Diagnostic::operator<<(pDVar5,&(this->super_SystemSubroutine).name);
              return this_00->errorType;
            }
            args_1 = local_3c + 2;
            local_3c[2] = 0;
          }
          else {
            pTVar3 = this_00->intType;
            args_1 = local_3c + 1;
            local_3c[1] = 0;
          }
        }
        else {
          pTVar3 = Type::getArrayElementType(pTVar3);
          args_1 = local_3c;
          local_3c[0] = 0;
        }
        pQVar4 = BumpAllocator::emplace<slang::ast::QueueType,slang::ast::Type_const&,unsigned_int>
                           (&this_00->super_BumpAllocator,pTVar3,args_1);
        return &pQVar4->super_Type;
      }
    }
    pTVar3 = this_00->errorType;
  }
  else {
    pTVar3 = this_00->errorType;
  }
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* iterExpr) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 0))
            return comp.getErrorType();

        if (!iterExpr) {
            context.addDiag(diag::ArrayLocatorWithClause, range) << name;
            return comp.getErrorType();
        }

        if (!context.requireBooleanConvertible(*iterExpr))
            return comp.getErrorType();

        auto arrayType = args[0]->type;
        if (isIndexed) {
            if (arrayType->isAssociativeArray()) {
                auto indexType = arrayType->getAssociativeIndexType();
                if (!indexType) {
                    context.addDiag(diag::AssociativeWildcardNotAllowed, range) << name;
                    return comp.getErrorType();
                }
                return *comp.emplace<QueueType>(*indexType, 0u);
            }
            return *comp.emplace<QueueType>(comp.getIntType(), 0u);
        }

        return *comp.emplace<QueueType>(*arrayType->getArrayElementType(), 0u);
    }